

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pointer.h
# Opt level: O0

Data * __thiscall
Corrade::Containers::Pointer<Corrade::TestSuite::Tester::Printer::Data>::operator->
          (Pointer<Corrade::TestSuite::Tester::Printer::Data> *this)

{
  undefined8 uVar1;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_39;
  Error local_38 [40];
  Pointer<Corrade::TestSuite::Tester::Printer::Data> *local_10;
  Pointer<Corrade::TestSuite::Tester::Printer::Data> *this_local;
  
  if (this->_pointer == (Data *)0x0) {
    local_10 = this;
    uVar1 = Corrade::Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_39);
    Corrade::Utility::Error::Error(local_38,uVar1,local_39._value);
    Corrade::Utility::Debug::operator<<
              ((Debug *)local_38,"Containers::Pointer: the pointer is null");
    Corrade::Utility::Error::~Error(local_38);
    abort();
  }
  return this->_pointer;
}

Assistant:

const T* operator->() const {
            CORRADE_DEBUG_ASSERT(_pointer, "Containers::Pointer: the pointer is null", nullptr);
            return _pointer;
        }